

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall
QMessageBoxPrivate::addOldButtons(QMessageBoxPrivate *this,int button0,int button1,int button2)

{
  QMessageBox *this_00;
  StandardButton SVar1;
  QPushButton *button;
  QAbstractButton *button_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  this_00 = *(QMessageBox **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  bVar2 = button0 - 1U < 0x3ff;
  SVar1 = button0 & ButtonMask;
  if (bVar2) {
    SVar1 = NoButton;
  }
  QMessageBox::addButton(this_00,SVar1);
  bVar3 = button1 - 1U < 0x3ff;
  SVar1 = button1 & ButtonMask;
  if (bVar3) {
    SVar1 = NoButton;
  }
  QMessageBox::addButton(this_00,SVar1);
  bVar4 = button2 - 1U < 0x3ff;
  SVar1 = button2 & ButtonMask;
  if (bVar4) {
    SVar1 = NoButton;
  }
  QMessageBox::addButton(this_00,SVar1);
  button = (QPushButton *)findButton(this,button0,button1,button2,0x100);
  QMessageBox::setDefaultButton(this_00,button);
  button_00 = findButton(this,button0,button1,button2,0x200);
  QMessageBox::setEscapeButton(this_00,button_00);
  this->compatMode = (bVar3 || bVar2) || bVar4;
  return;
}

Assistant:

void QMessageBoxPrivate::addOldButtons(int button0, int button1, int button2)
{
    Q_Q(QMessageBox);
    q->addButton(newButton(button0));
    q->addButton(newButton(button1));
    q->addButton(newButton(button2));
    q->setDefaultButton(
        static_cast<QPushButton *>(findButton(button0, button1, button2, QMessageBox::Default)));
    q->setEscapeButton(findButton(button0, button1, button2, QMessageBox::Escape));
    compatMode = detectedCompat(button0, button1, button2);
}